

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O2

void TTD::NSLogEvents::HasPropertyAction_Execute
               (EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  BOOL BVar1;
  ScriptContext *scriptContext;
  JsRTVarAndIntegralArgumentsAction_InternalUse<1UL,_1UL> *pJVar2;
  Var instance;
  RecyclableObject *value;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTVarAndIntegralArgumentsAction_InternalUse<1ul,1ul>,(TTD::NSLogEvents::EventKind)45>
                     (evt);
  instance = InflateVarInReplay(executeContext,pJVar2->VarArray[0]);
  if (instance != (Var)0x0) {
    BVar1 = Js::JavascriptOperators::IsObject(instance);
    if (BVar1 != 0) {
      value = Js::VarTo<Js::RecyclableObject>(instance);
      if ((((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
          scriptContext.ptr != scriptContext) {
        instance = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
      Js::JavascriptOperators::OP_HasProperty
                (instance,(PropertyId)pJVar2->ScalarArray[0],scriptContext);
      return;
    }
  }
  return;
}

Assistant:

void HasPropertyAction_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarScalarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarScalarArgumentAction, EventKind::HasPropertyActionTag>(evt);
            Js::Var var = InflateVarInReplay(executeContext, GetVarItem_0(action));
            TTD_REPLAY_VALIDATE_INCOMING_OBJECT(var, ctx);

            //Result is not needed but trigger computation for any effects
            Js::JavascriptOperators::OP_HasProperty(var, GetPropertyIdItem(action), ctx);
        }